

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O3

void multikey_cache<4u,false>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  uchar *puVar9;
  uchar *puVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  ulong uVar15;
  Cacheblock<4U>_conflict *pCVar16;
  Cacheblock<4U>_conflict *pCVar17;
  ulong uVar18;
  Cacheblock<4U>_conflict *pCVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  uint32_t uVar23;
  Cacheblock<4U>_conflict *pCVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  byte bVar28;
  long lVar29;
  ulong uVar30;
  Cacheblock<4U>_conflict __tmp;
  
  if (0x1f < N) {
    uVar15 = N >> 3;
    uVar3 = cache->cached_bytes;
    uVar6 = cache[uVar15].cached_bytes;
    pCVar16 = cache;
    if (uVar3 != uVar6) {
      pCVar16 = cache + (N >> 2);
      uVar7 = pCVar16->cached_bytes;
      if ((uVar7 != uVar3) && (uVar7 != uVar6)) {
        if (uVar3 < uVar6) {
          if (uVar7 <= uVar3) {
            pCVar16 = cache;
          }
          if (uVar6 < uVar7) {
            pCVar16 = cache + uVar15;
          }
        }
        else {
          if (uVar3 < uVar7) {
            pCVar16 = cache;
          }
          if (uVar7 < uVar6) {
            pCVar16 = cache + uVar15;
          }
        }
      }
    }
    uVar27 = N >> 1;
    pCVar17 = cache + (uVar27 - uVar15);
    uVar3 = cache[uVar27 - uVar15].cached_bytes;
    uVar6 = cache[uVar27].cached_bytes;
    pCVar19 = pCVar17;
    if (uVar3 != uVar6) {
      pCVar24 = cache + uVar27;
      pCVar19 = pCVar24 + uVar15;
      uVar7 = pCVar19->cached_bytes;
      if ((uVar7 != uVar3) && (uVar7 != uVar6)) {
        if (uVar3 < uVar6) {
          if (uVar3 < uVar7) {
            pCVar17 = pCVar19;
          }
          pCVar19 = pCVar17;
          if (uVar6 < uVar7) {
            pCVar19 = pCVar24;
          }
        }
        else {
          if (uVar3 < uVar7) {
            pCVar19 = pCVar17;
          }
          if (uVar7 < uVar6) {
            pCVar19 = pCVar24;
          }
        }
      }
    }
    lVar25 = (N - (N >> 2)) + -1;
    pCVar17 = cache + lVar25;
    lVar26 = (N - uVar15) + -1;
    uVar3 = cache[lVar25].cached_bytes;
    uVar6 = cache[lVar26].cached_bytes;
    pCVar24 = pCVar17;
    if (uVar3 != uVar6) {
      pCVar24 = cache + (N - 3);
      uVar7 = pCVar24->cached_bytes;
      if ((uVar7 != uVar3) && (uVar7 != uVar6)) {
        if (uVar3 < uVar6) {
          if (uVar3 < uVar7) {
            pCVar17 = pCVar24;
          }
          pCVar24 = pCVar17;
          if (uVar6 < uVar7) {
            pCVar24 = cache + lVar26;
          }
        }
        else {
          if (uVar3 < uVar7) {
            pCVar24 = pCVar17;
          }
          if (uVar7 < uVar6) {
            pCVar24 = cache + lVar26;
          }
        }
      }
    }
    uVar3 = pCVar16->cached_bytes;
    uVar6 = pCVar19->cached_bytes;
    pCVar17 = pCVar16;
    if (((uVar3 != uVar6) && (uVar7 = pCVar24->cached_bytes, pCVar17 = pCVar24, uVar7 != uVar3)) &&
       (uVar7 != uVar6)) {
      if (uVar3 < uVar6) {
        if (uVar3 < uVar7) {
          pCVar16 = pCVar24;
        }
        pCVar17 = pCVar16;
        if (uVar6 < uVar7) {
          pCVar17 = pCVar19;
        }
      }
      else {
        if (uVar3 < uVar7) {
          pCVar24 = pCVar16;
        }
        pCVar17 = pCVar24;
        if (uVar7 < uVar6) {
          pCVar17 = pCVar19;
        }
      }
    }
    uVar22 = N - 1;
    uVar23 = cache->cached_bytes;
    uVar14 = *(undefined4 *)&cache->field_0x4;
    puVar9 = cache->ptr;
    uVar4 = *(undefined4 *)&pCVar17->field_0x4;
    puVar10 = pCVar17->ptr;
    cache->cached_bytes = pCVar17->cached_bytes;
    *(undefined4 *)&cache->field_0x4 = uVar4;
    cache->ptr = puVar10;
    pCVar17->cached_bytes = uVar23;
    *(undefined4 *)&pCVar17->field_0x4 = uVar14;
    pCVar17->ptr = puVar9;
    uVar3 = cache->cached_bytes;
    uVar15 = 1;
    uVar18 = 1;
    uVar20 = uVar22;
    uVar27 = uVar22;
    do {
      if (uVar18 <= uVar20) {
        pCVar16 = cache + uVar18;
        uVar30 = uVar15;
        do {
          uVar15 = uVar30;
          if (uVar3 < pCVar16->cached_bytes) break;
          if (uVar3 <= pCVar16->cached_bytes) {
            uVar15 = uVar30 + 1;
            pCVar17 = cache + uVar30;
            uVar23 = pCVar17->cached_bytes;
            uVar14 = *(undefined4 *)&pCVar17->field_0x4;
            puVar9 = pCVar17->ptr;
            uVar4 = *(undefined4 *)&pCVar16->field_0x4;
            puVar10 = pCVar16->ptr;
            pCVar17 = cache + uVar30;
            pCVar17->cached_bytes = pCVar16->cached_bytes;
            *(undefined4 *)&pCVar17->field_0x4 = uVar4;
            pCVar17->ptr = puVar10;
            pCVar16->cached_bytes = uVar23;
            *(undefined4 *)&pCVar16->field_0x4 = uVar14;
            pCVar16->ptr = puVar9;
          }
          uVar18 = uVar18 + 1;
          pCVar16 = pCVar16 + 1;
          uVar30 = uVar15;
        } while (uVar18 <= uVar20);
      }
      if (uVar18 <= uVar20) {
        pCVar16 = cache + uVar20;
        uVar30 = uVar27;
        do {
          uVar27 = uVar30;
          if (pCVar16->cached_bytes < uVar3) break;
          if (pCVar16->cached_bytes == uVar3) {
            uVar27 = uVar30 - 1;
            pCVar17 = cache + uVar30;
            uVar23 = pCVar17->cached_bytes;
            uVar14 = *(undefined4 *)&pCVar17->field_0x4;
            puVar9 = pCVar17->ptr;
            uVar4 = *(undefined4 *)&pCVar16->field_0x4;
            puVar10 = pCVar16->ptr;
            pCVar17 = cache + uVar30;
            pCVar17->cached_bytes = pCVar16->cached_bytes;
            *(undefined4 *)&pCVar17->field_0x4 = uVar4;
            pCVar17->ptr = puVar10;
            pCVar16->cached_bytes = uVar23;
            *(undefined4 *)&pCVar16->field_0x4 = uVar14;
            pCVar16->ptr = puVar9;
          }
          uVar20 = uVar20 - 1;
          pCVar16 = pCVar16 + -1;
          uVar30 = uVar27;
        } while (uVar18 <= uVar20);
      }
      if (uVar20 < uVar18) {
        uVar22 = uVar22 - uVar27;
        uVar30 = uVar18 - uVar15;
        uVar27 = uVar27 - uVar20;
        uVar20 = uVar15;
        if (uVar30 < uVar15) {
          uVar20 = uVar30;
        }
        if (uVar20 != 0) {
          lVar26 = 0;
          do {
            puVar1 = (undefined8 *)((long)&cache->cached_bytes + lVar26);
            uVar8 = *puVar1;
            uVar12 = puVar1[1];
            puVar1 = (undefined8 *)((long)&cache[uVar18 - uVar20].cached_bytes + lVar26);
            uVar13 = puVar1[1];
            puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar26);
            *puVar2 = *puVar1;
            puVar2[1] = uVar13;
            puVar1 = (undefined8 *)((long)&cache[uVar18 - uVar20].cached_bytes + lVar26);
            *puVar1 = uVar8;
            puVar1[1] = uVar12;
            lVar26 = lVar26 + 0x10;
          } while (uVar20 * 0x10 != lVar26);
        }
        uVar20 = uVar22;
        if (uVar27 < uVar22) {
          uVar20 = uVar27;
        }
        if (uVar20 != 0) {
          lVar26 = 0;
          do {
            puVar1 = (undefined8 *)((long)&cache[uVar18].cached_bytes + lVar26);
            uVar8 = *puVar1;
            uVar12 = puVar1[1];
            puVar1 = (undefined8 *)((long)&cache[N - uVar20].cached_bytes + lVar26);
            uVar13 = puVar1[1];
            puVar2 = (undefined8 *)((long)&cache[uVar18].cached_bytes + lVar26);
            *puVar2 = *puVar1;
            puVar2[1] = uVar13;
            puVar1 = (undefined8 *)((long)&cache[N - uVar20].cached_bytes + lVar26);
            *puVar1 = uVar8;
            puVar1[1] = uVar12;
            lVar26 = lVar26 + 0x10;
          } while (uVar20 * 0x10 != lVar26);
        }
        multikey_cache<4u,false>(cache,uVar30,depth);
        multikey_cache<4u,false>(cache + uVar30 + uVar15 + uVar22,uVar27,depth);
        if ((char)uVar3 == '\0') {
          return;
        }
        multikey_cache<4u,true>(cache + uVar30,uVar15 + uVar22,depth + 4);
        return;
      }
      pCVar16 = cache + uVar18;
      uVar23 = pCVar16->cached_bytes;
      uVar14 = *(undefined4 *)&pCVar16->field_0x4;
      puVar9 = pCVar16->ptr;
      pCVar16 = cache + uVar20;
      uVar4 = *(undefined4 *)&pCVar16->field_0x4;
      puVar10 = pCVar16->ptr;
      pCVar17 = cache + uVar18;
      pCVar17->cached_bytes = pCVar16->cached_bytes;
      *(undefined4 *)&pCVar17->field_0x4 = uVar4;
      pCVar17->ptr = puVar10;
      pCVar16 = cache + uVar20;
      pCVar16->cached_bytes = uVar23;
      *(undefined4 *)&pCVar16->field_0x4 = uVar14;
      pCVar16->ptr = puVar9;
      uVar18 = uVar18 + 1;
      uVar20 = uVar20 - 1;
    } while( true );
  }
  if (1 < N) {
    uVar15 = N & 0xffffffff;
    pCVar16 = cache;
    do {
      uVar3 = pCVar16[1].cached_bytes;
      uVar4 = *(undefined4 *)((long)&pCVar16[1].ptr + 4);
      uVar8 = *(undefined8 *)&pCVar16[1].field_0x4;
      pCVar16 = pCVar16 + 1;
      pCVar17 = pCVar16;
      while ((cache < pCVar17 && (uVar3 < pCVar17[-1].cached_bytes))) {
        pCVar19 = pCVar17 + -1;
        uVar14 = *(undefined4 *)&pCVar19->field_0x4;
        puVar9 = pCVar17[-1].ptr;
        pCVar17->cached_bytes = pCVar19->cached_bytes;
        *(undefined4 *)&pCVar17->field_0x4 = uVar14;
        pCVar17->ptr = puVar9;
        pCVar17 = pCVar19;
      }
      iVar11 = (int)uVar15;
      pCVar17->cached_bytes = uVar3;
      *(undefined8 *)&pCVar17->field_0x4 = uVar8;
      *(undefined4 *)((long)&pCVar17->ptr + 4) = uVar4;
      uVar15 = (ulong)(iVar11 - 1);
    } while (2 < iVar11);
    if (N != 1) {
      uVar15 = 1;
      lVar26 = 0;
      lVar25 = 0;
      uVar23 = cache->cached_bytes;
      do {
        lVar25 = lVar25 + 1;
        uVar5 = cache[lVar25].cached_bytes;
        if (uVar23 == uVar5) {
          uVar15 = uVar15 + 1;
        }
        else {
          if ((1 < uVar15) && (1 < (int)uVar15 && (char)cache[lVar26].cached_bytes != '\0')) {
            pCVar16 = cache + lVar26;
            do {
              puVar9 = pCVar16[1].ptr;
              pCVar16 = pCVar16 + 1;
              for (pCVar17 = pCVar16; cache + lVar26 < pCVar17; pCVar17 = pCVar17 + -1) {
                puVar10 = pCVar17[-1].ptr;
                bVar21 = puVar10[depth + 4];
                bVar28 = puVar9[depth + 4];
                if ((bVar21 != 0) && (lVar29 = depth + 5, bVar21 == bVar28)) {
                  do {
                    bVar21 = puVar10[lVar29];
                    bVar28 = puVar9[lVar29];
                    if (bVar21 == 0) break;
                    lVar29 = lVar29 + 1;
                  } while (bVar21 == bVar28);
                }
                if (bVar21 <= bVar28) break;
                pCVar17->ptr = puVar10;
              }
              iVar11 = (int)uVar15;
              pCVar17->ptr = puVar9;
              uVar15 = (ulong)(iVar11 - 1);
            } while (2 < iVar11);
          }
          uVar15 = 1;
          lVar26 = lVar25;
        }
        uVar23 = uVar5;
      } while (lVar25 != N - 1);
      if (((1 < uVar15) && ((char)cache[lVar26].cached_bytes != '\0')) && (1 < (int)uVar15)) {
        pCVar16 = cache + lVar26;
        do {
          puVar9 = pCVar16[1].ptr;
          pCVar16 = pCVar16 + 1;
          for (pCVar17 = pCVar16; cache + lVar26 < pCVar17; pCVar17 = pCVar17 + -1) {
            puVar10 = pCVar17[-1].ptr;
            bVar21 = puVar10[depth + 4];
            bVar28 = puVar9[depth + 4];
            if ((bVar21 != 0) && (lVar25 = depth + 5, bVar21 == bVar28)) {
              do {
                bVar21 = puVar10[lVar25];
                bVar28 = puVar9[lVar25];
                if (bVar21 == 0) break;
                lVar25 = lVar25 + 1;
              } while (bVar21 == bVar28);
            }
            if (bVar21 <= bVar28) break;
            pCVar17->ptr = puVar10;
          }
          iVar11 = (int)uVar15;
          pCVar17->ptr = puVar9;
          uVar15 = (ulong)(iVar11 - 1);
        } while (2 < iVar11);
      }
    }
  }
  return;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}